

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsanchorlayout.cpp
# Opt level: O0

int __thiscall QGraphicsAnchor::qt_metacall(QGraphicsAnchor *this,Call _c,int _id,void **_a)

{
  int iVar1;
  uint in_EDX;
  int in_ESI;
  void **in_RDI;
  QObject *unaff_retaddr;
  int in_stack_fffffffffffffff8;
  Call in_stack_fffffffffffffffc;
  
  iVar1 = QObject::qt_metacall((Call)in_RDI,in_ESI,(void **)(ulong)in_EDX);
  if ((-1 < iVar1) &&
     ((((in_ESI == 1 || (in_ESI == 2)) || (in_ESI == 3)) || ((in_ESI == 8 || (in_ESI == 6)))))) {
    qt_static_metacall(unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,in_RDI);
    iVar1 = iVar1 + -2;
  }
  return iVar1;
}

Assistant:

int QGraphicsAnchor::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    return _id;
}